

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderControlStatementTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::WorkloadReferenceCase::init(WorkloadReferenceCase *this,EVP_PKEY_CTX *ctx)

{
  PerfCaseType PVar1;
  int iVar2;
  char *pcVar3;
  AttribSpec *ctx_00;
  ostringstream *poVar4;
  ostringstream vtx;
  ostringstream frag;
  AttribSpec AStack_3b8;
  Vec4 local_358;
  Vec4 local_348;
  Vec4 local_338;
  Vec4 local_328;
  ostringstream local_310 [376];
  ostringstream local_198 [376];
  
  PVar1 = (this->super_ControlStatementCase).super_ShaderPerformanceCase.m_caseType;
  std::__cxx11::ostringstream::ostringstream(local_310);
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar4 = local_198;
  if (PVar1 == CASETYPE_VERTEX) {
    poVar4 = local_310;
  }
  std::operator<<((ostream *)local_310,"#version 300 es\n");
  std::operator<<((ostream *)local_310,"in highp vec4 a_position;\n");
  std::operator<<((ostream *)local_310,"in mediump vec4 a_value;\n");
  std::operator<<((ostream *)local_198,"#version 300 es\n");
  std::operator<<((ostream *)local_198,"layout(location = 0) out mediump vec4 o_color;\n");
  if (PVar1 == CASETYPE_VERTEX) {
    std::operator<<((ostream *)local_310,"out mediump vec4 v_color;\n");
    pcVar3 = "in mediump vec4 v_color;\n";
  }
  else {
    std::operator<<((ostream *)local_310,"out mediump vec4 v_value;\n");
    pcVar3 = "in mediump vec4 v_value;\n";
  }
  std::operator<<((ostream *)local_198,pcVar3);
  ctx_00 = &AStack_3b8;
  std::operator<<((ostream *)local_310,"\n");
  std::operator<<((ostream *)local_310,"void main()\n");
  std::operator<<((ostream *)local_310,"{\n");
  std::operator<<((ostream *)local_310,"\tgl_Position = a_position;\n");
  std::operator<<((ostream *)local_198,"\n");
  std::operator<<((ostream *)local_198,"void main()\n");
  std::operator<<((ostream *)local_198,"{\n");
  std::operator<<((ostream *)poVar4,"\tmediump vec4 res;\n");
  pcVar3 = "v_value";
  if (PVar1 == CASETYPE_VERTEX) {
    pcVar3 = "a_value";
  }
  (*(this->super_ControlStatementCase).super_ShaderPerformanceCase.super_TestCase.super_TestNode.
    _vptr_TestNode[8])(this,poVar4,"res",pcVar3);
  if (PVar1 == CASETYPE_VERTEX) {
    std::operator<<((ostream *)local_310,"\tv_color = res;\n");
    pcVar3 = "\to_color = v_color;\n";
  }
  else {
    std::operator<<((ostream *)local_310,"\tv_value = a_value;\n");
    pcVar3 = "\to_color = res;\n";
  }
  std::operator<<((ostream *)local_198,pcVar3);
  std::operator<<((ostream *)local_310,"}\n");
  std::operator<<((ostream *)local_198,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_vertShaderSource,
             (string *)&AStack_3b8);
  std::__cxx11::string::~string((string *)&AStack_3b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)
             &(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_fragShaderSource,
             (string *)&AStack_3b8);
  std::__cxx11::string::~string((string *)&AStack_3b8);
  local_328.m_data[0] = 0.0;
  local_328.m_data[1] = 0.1;
  local_328.m_data[2] = 0.2;
  local_328.m_data[3] = 0.3;
  local_338.m_data[0] = 0.4;
  local_338.m_data[1] = 0.5;
  local_338.m_data[2] = 0.6;
  local_338.m_data[3] = 0.7;
  local_348.m_data[0] = 0.8;
  local_348.m_data[1] = 0.9;
  local_348.m_data[2] = 1.0;
  local_348.m_data[3] = 1.1;
  local_358.m_data[0] = 1.2;
  local_358.m_data[1] = 1.3;
  local_358.m_data[2] = 1.4;
  local_358.m_data[3] = 1.5;
  deqp::gls::AttribSpec::AttribSpec
            (&AStack_3b8,"a_value",&local_328,&local_338,&local_348,&local_358);
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
  emplace_back<deqp::gls::AttribSpec>
            (&(this->super_ControlStatementCase).super_ShaderPerformanceCase.m_attributes,
             &AStack_3b8);
  std::__cxx11::string::~string((string *)&AStack_3b8);
  ControlStatementCase::init(&this->super_ControlStatementCase,(EVP_PKEY_CTX *)ctx_00);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  iVar2 = std::__cxx11::ostringstream::~ostringstream(local_310);
  return iVar2;
}

Assistant:

void WorkloadReferenceCase::init (void)
{
	bool isVertexCase = m_caseType == CASETYPE_VERTEX;

	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op			= isVertexCase ? vtx : frag;

	vtx << "#version 300 es\n";
	vtx << "in highp vec4 a_position;\n";	// Position attribute.
	vtx << "in mediump vec4 a_value;\n";	// Value for workload calculations.

	frag << "#version 300 es\n";
	frag << "layout(location = 0) out mediump vec4 o_color;\n";

	// Varyings.
	if (isVertexCase)
	{
		vtx << "out mediump vec4 v_color;\n";
		frag << "in mediump vec4 v_color;\n";
	}
	else
	{
		vtx << "out mediump vec4 v_value;\n";
		frag << "in mediump vec4 v_value;\n";
	}

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";
	vtx << "	gl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	op << "\tmediump vec4 res;\n";
	writeWorkload(op, "res", isVertexCase ? "a_value" : "v_value");

	if (isVertexCase)
	{
		// Put result to color variable.
		vtx << "	v_color = res;\n";
		frag << "	o_color = v_color;\n";
	}
	else
	{
		vtx << "	v_value = a_value;\n";	// Transfer input to fragment shader through varying.
		frag << "	o_color = res;\n";	// Put result to color variable.
	}

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource = vtx.str();
	m_fragShaderSource = frag.str();

	m_attributes.push_back(AttribSpec("a_value",	Vec4(0.0f, 0.1f, 0.2f, 0.3f),
													Vec4(0.4f, 0.5f, 0.6f, 0.7f),
													Vec4(0.8f, 0.9f, 1.0f, 1.1f),
													Vec4(1.2f, 1.3f, 1.4f, 1.5f)));

	ControlStatementCase::init();
}